

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,color3d *value)

{
  bool bVar1;
  double3 v;
  array<double,_3UL> local_28;
  
  bVar1 = ParseBasicTypeTuple<double,3ul>(this,&local_28);
  if (bVar1) {
    value->r = local_28._M_elems[0];
    value->g = local_28._M_elems[1];
    value->b = local_28._M_elems[2];
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::color3d *value) {
  value::double3 v;
  if (ParseBasicTypeTuple(&v)) {
    value->r = v[0];
    value->g = v[1];
    value->b = v[2];
    return true;
  }
  return false;
}